

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int __thiscall DLevelScript::GetPlayerInput(DLevelScript *this,int playernum,int inputnum)

{
  bool bVar1;
  AActor *pAVar2;
  player_t *local_28;
  player_t *p;
  int inputnum_local;
  int playernum_local;
  DLevelScript *this_local;
  
  if (playernum < 0) {
    bVar1 = TObjPtr<AActor>::operator==(&this->activator,(AActor *)0x0);
    if (bVar1) {
      return 0;
    }
    pAVar2 = TObjPtr<AActor>::operator->(&this->activator);
    local_28 = pAVar2->player;
  }
  else {
    if ((7 < playernum) || ((playeringame[playernum] & 1U) == 0)) {
      return 0;
    }
    local_28 = (player_t *)(&players + (long)playernum * 0x54);
  }
  if (local_28 == (player_t *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = P_Thing_CheckInputNum(local_28,inputnum);
  }
  return this_local._4_4_;
}

Assistant:

int DLevelScript::GetPlayerInput(int playernum, int inputnum)
{
	player_t *p;

	if (playernum < 0)
	{
		if (activator == NULL)
		{
			return 0;
		}
		p = activator->player;
	}
	else if (playernum >= MAXPLAYERS || !playeringame[playernum])
	{
		return 0;
	}
	else
	{
		p = &players[playernum];
	}
	if (p == NULL)
	{
		return 0;
	}

	return P_Thing_CheckInputNum(p, inputnum);
}